

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O2

bool __thiscall
MissingDependencyScanner::PathExistsBetween(MissingDependencyScanner *this,Edge *from,Edge *to)

{
  pointer ppNVar1;
  Edge *to_00;
  bool bVar2;
  _Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
  _Var3;
  iterator iVar4;
  bool bVar5;
  size_t i;
  ulong uVar6;
  pair<std::__detail::_Node_iterator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false,_false>,_bool>
  pVar7;
  Edge *local_b0;
  Edge *local_a8;
  _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  Edge *local_68;
  _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_60;
  
  local_b0 = to;
  local_a8 = from;
  _Var3._M_cur = (__node_type *)
                 std::
                 _Hashtable<Edge_*,_std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_std::allocator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->adjacency_map_)._M_h,&local_a8);
  if (_Var3._M_cur == (__node_type *)0x0) {
    local_a0._M_buckets = &local_a0._M_single_bucket;
    local_a0._M_bucket_count = 1;
    local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a0._M_element_count = 0;
    local_a0._M_rehash_policy._M_max_load_factor = 1.0;
    local_a0._M_rehash_policy._4_4_ = 0;
    local_a0._M_rehash_policy._M_next_resize = 0;
    local_a0._M_single_bucket = (__node_base_ptr)0x0;
    local_68 = local_a8;
    std::
    _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_60,&local_a0);
    pVar7 = std::
            _Hashtable<Edge*,std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>,std::allocator<std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::pair<Edge*,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>
                      ((_Hashtable<Edge*,std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>,std::allocator<std::pair<Edge*const,std::unordered_map<Edge*,bool,std::hash<Edge*>,std::equal_to<Edge*>,std::allocator<std::pair<Edge*const,bool>>>>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->adjacency_map_,&local_68);
    _Var3._M_cur = (__node_type *)
                   pVar7.first.
                   super__Node_iterator_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                   ._M_cur;
    std::
    _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_60);
    std::
    _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_a0);
  }
  else {
    iVar4 = std::
            _Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<Edge_*,_std::pair<Edge_*const,_bool>,_std::allocator<std::pair<Edge_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<Edge_*>,_std::hash<Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)_Var3._M_cur + 0x10),&local_b0);
    if (iVar4.super__Node_iterator_base<std::pair<Edge_*const,_bool>,_false>._M_cur !=
        (__node_type *)0x0) {
      return (bool)*(undefined1 *)
                    ((long)iVar4.super__Node_iterator_base<std::pair<Edge_*const,_bool>,_false>.
                           _M_cur + 0x10);
    }
  }
  for (uVar6 = 0;
      ppNVar1 = (local_b0->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(local_b0->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3);
      uVar6 = uVar6 + 1) {
    to_00 = ppNVar1[uVar6]->in_edge_;
    if ((to_00 != (Edge *)0x0) &&
       ((bVar5 = true, to_00 == local_a8 || (bVar2 = PathExistsBetween(this,local_a8,to_00), bVar2))
       )) goto LAB_00118fe3;
  }
  bVar5 = false;
LAB_00118fe3:
  local_68 = local_b0;
  local_60._M_buckets._0_1_ = bVar5;
  std::
  _Hashtable<Edge*,std::pair<Edge*const,bool>,std::allocator<std::pair<Edge*const,bool>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<Edge*,bool>>
            ((_Hashtable<Edge*,std::pair<Edge*const,bool>,std::allocator<std::pair<Edge*const,bool>>,std::__detail::_Select1st,std::equal_to<Edge*>,std::hash<Edge*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)((long)&((_Var3._M_cur)->
                        super__Hash_node_value<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>_>
                        ._M_storage._M_storage + 8));
  return bVar5;
}

Assistant:

bool MissingDependencyScanner::PathExistsBetween(Edge* from, Edge* to) {
  AdjacencyMap::iterator it = adjacency_map_.find(from);
  if (it != adjacency_map_.end()) {
    InnerAdjacencyMap::iterator inner_it = it->second.find(to);
    if (inner_it != it->second.end()) {
      return inner_it->second;
    }
  } else {
    it = adjacency_map_.insert(std::make_pair(from, InnerAdjacencyMap())).first;
  }
  bool found = false;
  for (size_t i = 0; i < to->inputs_.size(); ++i) {
    Edge* e = to->inputs_[i]->in_edge();
    if (e && (e == from || PathExistsBetween(from, e))) {
      found = true;
      break;
    }
  }
  it->second.insert(std::make_pair(to, found));
  return found;
}